

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

void __thiscall Fl_Function_Type::write_code1(Fl_Function_Type *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char **ppcVar5;
  char *pcVar6;
  size_t __n;
  char *pcVar7;
  char *pcVar8;
  int iVar9;
  char cVar10;
  long lVar11;
  Fl_Type *l;
  Fl_Function_Type *pFVar12;
  bool bVar13;
  char s [1024];
  char *local_458;
  char local_438 [1032];
  
  this->constructor = '\0';
  this->havewidgets = '\0';
  l = (this->super_Fl_Type).next;
  if (l == (Fl_Type *)0x0) {
    l = (Fl_Type *)0x0;
LAB_00179021:
    if ((this->super_Fl_Type).name_ == (char *)0x0) goto LAB_00179795;
    bVar2 = true;
  }
  else {
    iVar4 = l->level;
    iVar9 = (this->super_Fl_Type).level;
    if (iVar9 < iVar4) {
      do {
        iVar3 = (*l->_vptr_Fl_Type[0x17])();
        if (iVar3 != 0) {
          this->havewidgets = '\x01';
          goto LAB_00179041;
        }
        l = l->next;
        if (l == (Fl_Type *)0x0) {
          l = (Fl_Type *)0x0;
          goto LAB_00179041;
        }
      } while ((this->super_Fl_Type).level < l->level);
    }
    if (iVar4 <= iVar9) goto LAB_00179021;
LAB_00179041:
    bVar2 = false;
    write_c("\n");
    if ((this->super_Fl_Type).name_ == (char *)0x0) {
      write_c("int main(int argc, char **argv) {\n");
      goto LAB_00179795;
    }
  }
  ppcVar5 = &(this->super_Fl_Type).name_;
  pcVar8 = this->return_type;
  pFVar12 = this;
  if (pcVar8 == (char *)0x0) {
    bVar13 = false;
    bVar1 = true;
LAB_00179119:
    if (this->havewidgets == '\0') {
      local_458 = "";
      pcVar6 = "void";
    }
    else {
      pcVar6 = subclassname(l);
      local_458 = "*";
    }
  }
  else {
    iVar4 = strcmp(pcVar8,"static");
    if (iVar4 == 0) {
      bVar13 = true;
      pcVar6 = (char *)0x0;
    }
    else {
      iVar4 = strncmp(pcVar8,"static ",7);
      bVar13 = iVar4 == 0;
      pcVar6 = pcVar8 + 7;
      if (!bVar13) {
        pcVar6 = pcVar8;
      }
    }
    iVar4 = strcmp(pcVar6,"virtual");
    if (iVar4 == 0) {
      bVar1 = false;
      goto LAB_00179119;
    }
    iVar4 = strncmp(pcVar6,"virtual ",8);
    local_458 = "";
    if (iVar4 == 0) {
      pcVar6 = pcVar6 + 8;
      bVar1 = false;
    }
    else {
      bVar1 = true;
      if (pcVar6 == (char *)0x0) goto LAB_00179119;
    }
  }
  do {
    pFVar12 = (Fl_Function_Type *)(pFVar12->super_Fl_Type).parent;
    if (pFVar12 == (Fl_Function_Type *)0x0) goto LAB_001791c4;
    iVar4 = (*(pFVar12->super_Fl_Type)._vptr_Fl_Type[0x26])();
  } while (iVar4 == 0);
  pcVar8 = (pFVar12->super_Fl_Type).name_;
  if (pcVar8 != (char *)0x0) {
    if (!bVar2) {
      Fl_Type::write_comment_c(&this->super_Fl_Type,"");
    }
    write_public((int)this->public_);
    pcVar7 = (this->super_Fl_Type).name_;
    if (*pcVar7 != '~') {
      __n = strlen(pcVar8);
      iVar4 = strncmp(pcVar7,pcVar8,__n);
      if ((iVar4 != 0) || (pcVar7[__n] != '(')) goto LAB_00179269;
    }
    this->constructor = '\x01';
LAB_00179269:
    write_h("  ");
    if (bVar13) {
      write_h("static ");
    }
    if (!bVar1) {
      write_h("virtual ");
    }
    if ((this->constructor == '\0') && (write_h("%s%s ",pcVar6,local_458), !bVar2)) {
      write_c("%s%s ",pcVar6,local_458);
    }
    pcVar7 = *ppcVar5;
    pcVar6 = local_438;
    do {
      cVar10 = *pcVar7;
      if (cVar10 == ':') {
        if (pcVar7[1] != ':') goto LAB_00179315;
        pcVar7 = pcVar7 + 1;
        *pcVar6 = ':';
        pcVar6 = pcVar6 + 1;
        cVar10 = *pcVar7;
      }
      else if (cVar10 == '\0') goto LAB_00179315;
      pcVar7 = pcVar7 + 1;
      *pcVar6 = cVar10;
      pcVar6 = pcVar6 + 1;
    } while( true );
  }
LAB_001791c4:
  if (bVar2) {
    if (this->public_ != '\0') {
LAB_001791ff:
      if (this->cdecl_ == '\0') {
        pcVar8 = "%s%s %s;\n";
      }
      else {
        pcVar8 = "extern \"C\" { %s%s %s; }\n";
      }
      write_h(pcVar8,pcVar6,local_458,(this->super_Fl_Type).name_);
    }
  }
  else {
    Fl_Type::write_comment_c(&this->super_Fl_Type,"");
    if (this->public_ != '\0') goto LAB_001791ff;
    write_c("static ");
  }
  pcVar8 = *ppcVar5;
  cVar10 = *pcVar8;
  if (cVar10 == '\0') {
    pcVar7 = local_438;
  }
  else {
    iVar9 = 0;
    pcVar7 = local_438;
    iVar4 = 0;
    bVar1 = false;
    bVar13 = false;
    lVar11 = 0;
    do {
      if ((bVar13) || (cVar10 != '(')) {
        if (!bVar13) {
          iVar9 = iVar9 - (uint)(cVar10 == ')');
          if (cVar10 == '\"') goto LAB_001795e0;
          bVar13 = false;
          if ((cVar10 == '\'') && ((bVar13 = false, iVar4 == 0 || (pcVar8[-1] != '\\')))) {
            bVar1 = !bVar1;
          }
          goto LAB_0017960a;
        }
        if (cVar10 == '\"') {
LAB_001795e0:
          if ((iVar4 == 0) || (pcVar8[-1] != '\\')) {
            bVar13 = !bVar13;
            goto LAB_0017960a;
          }
          if (!bVar13) goto LAB_0017958b;
          bVar13 = true;
          cVar10 = '\"';
        }
        else {
          bVar13 = true;
        }
      }
      else {
        iVar9 = iVar9 + 1;
LAB_0017958b:
        bVar13 = false;
LAB_0017960a:
        if (((!bVar13) && (!bVar1)) && (iVar9 == 1)) {
          if ((cVar10 == '=') && ((iVar4 == 0 || (cVar10 = '=', pcVar8[-1] != '\'')))) {
            cVar10 = pcVar8[1];
            pcVar8 = pcVar8 + 1;
            if (cVar10 != '\0') {
              bVar1 = false;
              iVar9 = 1;
              bVar13 = false;
              do {
                if ((bool)(bVar13 | bVar1)) {
LAB_0017966b:
                  if (cVar10 == '\"') {
                    if (pcVar8[-1] == '\\') {
                      if (bVar13) goto LAB_0017969d;
                      bVar13 = false;
                    }
                    else {
                      bVar13 = !bVar13;
                    }
                    goto LAB_001796dd;
                  }
                  if (!bVar13) {
                    bVar13 = false;
                    if ((cVar10 == '\'') && (bVar13 = false, pcVar8[-1] != '\\')) {
                      bVar1 = !bVar1;
                    }
                    goto LAB_001796dd;
                  }
LAB_0017969d:
                  bVar13 = true;
                }
                else {
                  if (cVar10 != ',') {
                    if ((cVar10 != ')') || (iVar9 != 1)) goto LAB_0017966b;
                    cVar10 = ')';
                    goto LAB_0017973f;
                  }
                  bVar13 = false;
                  if (iVar9 == 1) {
                    cVar10 = ',';
                    goto LAB_0017973f;
                  }
                  bVar1 = false;
LAB_001796dd:
                  if ((bool)(bVar13 | bVar1)) {
                    if (bVar13) goto LAB_0017970d;
LAB_001796fc:
                    iVar9 = iVar9 - (uint)(cVar10 == ')');
                  }
                  else {
                    bVar1 = false;
                    if (cVar10 != '(') goto LAB_001796fc;
                    iVar9 = iVar9 + 1;
                    bVar1 = false;
                  }
                  bVar13 = false;
                }
LAB_0017970d:
                cVar10 = pcVar8[1];
                pcVar8 = pcVar8 + 1;
              } while (cVar10 != '\0');
              cVar10 = '\0';
              goto LAB_00179742;
            }
            cVar10 = '\0';
          }
LAB_0017973f:
          bVar13 = false;
          iVar9 = 1;
          bVar1 = false;
        }
      }
LAB_00179742:
      if (lVar11 < 0x3ff) {
        lVar11 = lVar11 + 1;
        *pcVar7 = cVar10;
      }
      iVar4 = iVar4 + 1;
      pcVar7 = local_438 + lVar11;
      cVar10 = pcVar8[1];
      pcVar8 = pcVar8 + 1;
    } while (cVar10 != '\0');
  }
  *pcVar7 = '\0';
  if (!bVar2) {
    write_c("%s%s %s {\n",pcVar6,local_458,local_438);
  }
LAB_00179795:
  if ((this->havewidgets != '\0') && (l->name_ == (char *)0x0)) {
    pcVar8 = subclassname(l);
    write_c("  %s* w;\n",pcVar8);
  }
  indentation = indentation + 2;
  return;
LAB_00179315:
  *pcVar6 = '\0';
  iVar4 = 0;
  pcVar6 = local_438;
  write_h("%s;\n");
  pcVar7 = *ppcVar5;
  cVar10 = *pcVar7;
  if (cVar10 != '\0') {
    pcVar6 = local_438;
    iVar9 = 0;
    bVar1 = false;
    bVar13 = false;
    lVar11 = 0;
    do {
      if ((bVar13) || (cVar10 != '(')) {
        if (!bVar13) {
          iVar4 = iVar4 - (uint)(cVar10 == ')');
          if (cVar10 == '\"') goto LAB_001793ab;
          bVar13 = false;
          if ((cVar10 == '\'') && ((bVar13 = false, iVar9 == 0 || (pcVar7[-1] != '\\')))) {
            bVar1 = !bVar1;
          }
          goto LAB_001793d2;
        }
        if (cVar10 == '\"') {
LAB_001793ab:
          if ((iVar9 == 0) || (pcVar7[-1] != '\\')) {
            bVar13 = !bVar13;
            goto LAB_001793d2;
          }
          if (!bVar13) goto LAB_0017935b;
          bVar13 = true;
          cVar10 = '\"';
        }
        else {
          bVar13 = true;
        }
      }
      else {
        iVar4 = iVar4 + 1;
LAB_0017935b:
        bVar13 = false;
LAB_001793d2:
        if (((!bVar13) && (!bVar1)) && (iVar4 == 1)) {
          if ((cVar10 == '=') && ((iVar9 == 0 || (cVar10 = '=', pcVar7[-1] != '\'')))) {
            cVar10 = pcVar7[1];
            pcVar7 = pcVar7 + 1;
            if (cVar10 != '\0') {
              bVar1 = false;
              iVar4 = 1;
              bVar13 = false;
              do {
                if ((bool)(bVar13 | bVar1)) {
LAB_00179431:
                  if (cVar10 == '\"') {
                    if (pcVar7[-1] == '\\') {
                      if (bVar13) goto LAB_0017945f;
                      bVar13 = false;
                    }
                    else {
                      bVar13 = !bVar13;
                    }
                    goto LAB_0017949c;
                  }
                  if (!bVar13) {
                    bVar13 = false;
                    if ((cVar10 == '\'') && (bVar13 = false, pcVar7[-1] != '\\')) {
                      bVar1 = !bVar1;
                    }
                    goto LAB_0017949c;
                  }
LAB_0017945f:
                  bVar13 = true;
                }
                else {
                  if (cVar10 != ',') {
                    if ((cVar10 != ')') || (iVar4 != 1)) goto LAB_00179431;
                    cVar10 = ')';
                    goto LAB_001794fa;
                  }
                  bVar13 = false;
                  if (iVar4 == 1) {
                    cVar10 = ',';
                    goto LAB_001794fa;
                  }
                  bVar1 = false;
LAB_0017949c:
                  if ((bool)(bVar13 | bVar1)) {
                    if (bVar13) goto LAB_001794c8;
LAB_001794b9:
                    iVar4 = iVar4 - (uint)(cVar10 == ')');
                  }
                  else {
                    bVar1 = false;
                    if (cVar10 != '(') goto LAB_001794b9;
                    iVar4 = iVar4 + 1;
                    bVar1 = false;
                  }
                  bVar13 = false;
                }
LAB_001794c8:
                cVar10 = pcVar7[1];
                pcVar7 = pcVar7 + 1;
              } while (cVar10 != '\0');
              cVar10 = '\0';
              goto LAB_001794fc;
            }
            cVar10 = '\0';
          }
LAB_001794fa:
          bVar13 = false;
          iVar4 = 1;
          bVar1 = false;
        }
      }
LAB_001794fc:
      if (lVar11 < 0x3ff) {
        lVar11 = lVar11 + 1;
        *pcVar6 = cVar10;
      }
      iVar9 = iVar9 + 1;
      pcVar6 = local_438 + lVar11;
      cVar10 = pcVar7[1];
      pcVar7 = pcVar7 + 1;
    } while (cVar10 != '\0');
  }
  *pcVar6 = '\0';
  if (!bVar2) {
    write_c("%s::%s {\n",pcVar8,local_438);
  }
  goto LAB_00179795;
}

Assistant:

void Fl_Function_Type::write_code1() {
  constructor=0;
  havewidgets = 0;
  Fl_Type *child;
  // if the function has no children (hence no body), Fluid will not generate
  // the function either. This is great if you decide to implement that function
  // inside another module
  char havechildren = 0;
  for (child = next; child && child->level > level; child = child->next) {
    havechildren = 1;
    if (child->is_widget()) {
      havewidgets = 1;
      break;
    }
  }
  if (havechildren)
    write_c("\n");
  if (ismain()) {
    if (havechildren)
      write_c("int main(int argc, char **argv) {\n");
  } else {
    const char* rtype = return_type;
    const char* star = "";
    // from matt: let the user type "static " at the start of type
    // in order to declare a static method;
    int is_static = 0;
    int is_virtual = 0;
    if (rtype) {
      if (!strcmp(rtype,"static")) {is_static = 1; rtype = 0;}
      else if (!strncmp(rtype, "static ",7)) {is_static = 1; rtype += 7;}
      if (!strcmp(rtype, "virtual")) {is_virtual = 1; rtype = 0;}
      else if (!strncmp(rtype, "virtual ",8)) {is_virtual = 1; rtype += 8;}
    }
    if (!rtype) {
      if (havewidgets) {
        rtype = subclassname(child);
        star = "*";
      } else rtype = "void";
    }
    
    const char* k = class_name(0);
    if (k) {
      if (havechildren)
        write_comment_c();
      write_public(public_);
      if (name()[0] == '~')
        constructor = 1;
      else {
        size_t n = strlen(k);
        if (!strncmp(name(), k, n) && name()[n] == '(') constructor = 1;
      }
      write_h("  ");
      if (is_static) write_h("static ");
      if (is_virtual) write_h("virtual ");
      if (!constructor) {
        write_h("%s%s ", rtype, star);
        if (havechildren)
          write_c("%s%s ", rtype, star);
      }
      
      // if this is a subclass, only write_h() the part before the ':'
      char s[1024], *sptr = s;
      char *nptr = (char *)name();
      
      while (*nptr) {
        if (*nptr == ':') {
          if (nptr[1] != ':') break;
          // Copy extra ":" for "class::member"...
          *sptr++ = *nptr++;
        }	  
        *sptr++ = *nptr++;
      }
      *sptr = '\0';
      
      write_h("%s;\n", s);
      // skip all function default param. init in body:
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s::%s {\n", k, s);
    } else {
      if (havechildren)
        write_comment_c();
      if (public_) {
        if (cdecl_)
          write_h("extern \"C\" { %s%s %s; }\n", rtype, star, name());
        else
          write_h("%s%s %s;\n", rtype, star, name());
      } else {
        if (havechildren)
          write_c("static ");
      }
      
      // write everything but the default parameters (if any)
      char s[1024], *sptr;
      char *nptr;
      int skips=0,skipc=0;
      int nc=0,plevel=0;
      for (sptr=s,nptr=(char*)name(); *nptr; nc++,nptr++) {
        if (!skips && *nptr=='(') plevel++;
        else if (!skips && *nptr==')') plevel--;
        if ( *nptr=='"' &&  !(nc &&  *(nptr-1)=='\\') ) 
          skips = skips ? 0 : 1;
        else if(!skips && *nptr=='\'' &&  !(nc &&  *(nptr-1)=='\\'))
          skipc = skipc ? 0 : 1;
        if(!skips && !skipc && plevel==1 && *nptr =='=' && 
           !(nc && *(nptr-1)=='\'') ) // ignore '=' case 
          while(*++nptr  && (skips || skipc || ( (*nptr!=',' && *nptr!=')') || plevel!=1) )) {
            if ( *nptr=='"' &&  *(nptr-1)!='\\' ) 
              skips = skips ? 0 : 1;
            else if(!skips && *nptr=='\'' &&  *(nptr-1)!='\\')
              skipc = skipc ? 0 : 1;
            if (!skips && !skipc && *nptr=='(') plevel++;
            else if (!skips && *nptr==')') plevel--;
          }
        
        if (sptr < (s + sizeof(s) - 1))	*sptr++ = *nptr;
      }
      *sptr = '\0';
      
      if (havechildren)
        write_c("%s%s %s {\n", rtype, star, s);
    }
  }
  
  if (havewidgets && !child->name()) write_c("  %s* w;\n", subclassname(child));
  indentation += 2;
}